

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlsbench.c
# Opt level: O0

int main(int argc,char **argv)

{
  int basic_ref_00;
  int iVar1;
  size_t sVar2;
  ulong local_2c8;
  size_t i;
  utsname uts;
  char HW [128];
  char OS [128];
  uint64_t uStack_30;
  int basic_ref;
  uint64_t s;
  uint64_t x;
  int force_all_tests;
  int ret;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  x._4_4_ = 0;
  x._0_4_ = 0;
  s = 0xdeadbeef;
  uStack_30 = 0;
  _force_all_tests = argv;
  argv_local._0_4_ = argc;
  basic_ref_00 = bench_basic(&s);
  HW[0x78] = '\0';
  uts.domainname[0x39] = '\0';
  iVar1 = uname((utsname *)((long)&i + 2));
  if (iVar1 == 0) {
    sVar2 = strlen((char *)((long)&i + 2));
    if (sVar2 + 1 < 0x80) {
      strcpy(HW + 0x78,(char *)((long)&i + 2));
    }
    sVar2 = strlen(uts.version + 0x39);
    if (sVar2 + 1 < 0x80) {
      strcpy(uts.domainname + 0x39,uts.version + 0x39);
    }
  }
  if (((int)argv_local == 2) && (iVar1 = strcmp(_force_all_tests[1],"-f"), iVar1 == 0)) {
    x._0_4_ = 1;
  }
  else if (1 < (int)argv_local) {
    fprintf(_stderr,"Usage: %s [-f]\n   Use option \"-f\" to force execution of the slower tests.\n"
            ,*_force_all_tests);
    exit(-1);
  }
  printf(
        "OS, HW, bits, mode, 10M ops, provider, version, algorithm, N, L, encrypt us, decrypt us, encrypt mbps, decrypt mbps,\n"
        );
  for (local_2c8 = 0; x._4_4_ == 0 && local_2c8 < nb_aead_list; local_2c8 = local_2c8 + 1) {
    if ((aead_list[local_2c8].enabled_by_defaut != 0) || ((int)x != 0)) {
      x._4_4_ = bench_run_aead(HW + 0x78,uts.domainname + 0x39,basic_ref_00,s,
                               aead_list[local_2c8].provider,aead_list[local_2c8].algo_name,
                               aead_list[local_2c8].aead,aead_list[local_2c8].hash,1000,0x5dc,
                               &stack0xffffffffffffffd0);
    }
  }
  if (uStack_30 == 0) {
    printf("Unexpected value of test sum s = %llx\n",0);
  }
  return x._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;
    int force_all_tests = 0;
    uint64_t x = 0xdeadbeef;
    uint64_t s = 0;
    int basic_ref = bench_basic(&x);
    char OS[128];
    char HW[128];
#ifndef _WINDOWS
    struct utsname uts;
#endif

#ifdef _WINDOWS
    (void)strcpy_s(OS, sizeof(OS), "windows");
    (void)strcpy_s(HW, sizeof(HW), "x86_64");
#else
    OS[0] = 0;
    HW[0] = 0;
    if (uname(&uts) == 0) {
        if (strlen(uts.sysname) + 1 < sizeof(OS)) {
            strcpy(OS, uts.sysname);
        }
        if (strlen(uts.machine) + 1 < sizeof(HW)) {
            strcpy(HW, uts.machine);
        }
    }
#endif

#ifdef PTLS_HAVE_MBEDTLS
    if (psa_crypto_init() != PSA_SUCCESS) {
        fprintf(stderr, "psa_crypto_init fails.\n");
        exit(-1);
    }
#endif

    if (argc == 2 && strcmp(argv[1], "-f") == 0) {
        force_all_tests = 1;
    } else if (argc > 1) {
        fprintf(stderr, "Usage: %s [-f]\n   Use option \"-f\" to force execution of the slower tests.\n", argv[0]);
        exit(-1);
    }

    printf(
        "OS, HW, bits, mode, 10M ops, provider, version, algorithm, N, L, encrypt us, decrypt us, encrypt mbps, decrypt mbps,\n");

    for (size_t i = 0; ret == 0 && i < nb_aead_list; i++) {
        if (aead_list[i].enabled_by_defaut || force_all_tests) {
            ret = bench_run_aead(OS, HW, basic_ref, x, aead_list[i].provider, aead_list[i].algo_name, aead_list[i].aead,
                                 aead_list[i].hash, 1000, 1500, &s);
        }
    }

    /* Gratuitous test, designed to ensure that the initial computation
     * of the basic reference benchmark is not optimized away. */
    if (s == 0) {
        printf("Unexpected value of test sum s = %llx\n", (unsigned long long)s);
    }

#ifdef PTLS_HAVE_MBEDTLS
    /* Deinitialize the PSA crypto library. */
    mbedtls_psa_crypto_free();
#endif

    return ret;
}